

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int nni_proto_open(nng_socket *sip,nni_proto *proto)

{
  int iVar1;
  uint32_t uVar2;
  nni_sock *pnStack_28;
  nng_socket s;
  nni_sock *sock;
  int rv;
  nni_proto *proto_local;
  nng_socket *sip_local;
  
  iVar1 = nni_sock_open(&stack0xffffffffffffffd8,proto);
  if (iVar1 == 0) {
    uVar2 = nni_sock_id(pnStack_28);
    sip->id = uVar2;
  }
  return iVar1;
}

Assistant:

int
nni_proto_open(nng_socket *sip, const nni_proto *proto)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_open(&sock, proto)) == 0) {
		nng_socket s;
		s.id = nni_sock_id(sock); // Keep socket held open.
		*sip = s;
	}
	return (rv);
}